

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyProcess.h
# Opt level: O1

void __thiscall MyProcess::set_input_file(MyProcess *this,string *file_name)

{
  pointer pcVar1;
  MyHandler *this_00;
  string local_48;
  
  if (this->in != (Handler *)0x0) {
    (*this->in->_vptr_Handler[4])();
  }
  this_00 = (MyHandler *)operator_new(0x10);
  pcVar1 = (file_name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + file_name->_M_string_length);
  MyHandler::MyHandler(this_00,&local_48);
  this->in = (Handler *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void set_input_file(std::string file_name) {
        delete in;
        in = new MyHandler(file_name);
    }